

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O3

RC __thiscall
SM_Manager::CreateTable(SM_Manager *this,char *relName,int attrCount,AttrInfo *attributes)

{
  AttrType AVar1;
  undefined8 uVar2;
  AttrInfo *pAVar3;
  AttrType type;
  RC RVar4;
  RC RVar5;
  size_t sVar6;
  ostream *poVar7;
  iterator iVar8;
  AttrType *pAVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  int iVar15;
  AttrInfo attr;
  RID rid;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relAttributes;
  int local_b8;
  allocator local_b1;
  SM_Manager *local_b0;
  char *local_a8;
  ulong local_a0;
  AttrInfo *local_98;
  key_type local_90;
  ulong local_70;
  long local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  uVar11 = (ulong)(uint)attrCount;
  local_b0 = this;
  local_98 = attributes;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CreateTable\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName     =",0x10);
  local_a8 = relName;
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d8);
  }
  else {
    sVar6 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attrCount   =",0x10);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,attrCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  local_a0 = uVar11;
  if (0 < attrCount) {
    piVar10 = &local_98->attrLength;
    uVar13 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   attributes[",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"].attrName=",0xb);
      pcVar14 = ((AttrInfo *)(piVar10 + -3))->attrName;
      if (pcVar14 == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   attrType=",0xc);
      AVar1 = piVar10[-1];
      pcVar14 = "INT";
      if (AVar1 != INT) {
        if (AVar1 == MBR) {
          pcVar14 = "MBR";
        }
        else {
          pcVar14 = "STRING";
          if (AVar1 == FLOAT) {
            pcVar14 = "FLOAT";
          }
        }
      }
      sVar6 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar14,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"   attrLength=",0xe);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*piVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      uVar13 = uVar13 + 1;
      piVar10 = piVar10 + 4;
    } while (uVar11 != uVar13);
  }
  uVar11 = local_a0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)local_a0 - 0x29U < 0xffffffd8) {
    puts("reaches here");
LAB_001086a8:
    RVar5 = 0x12f;
  }
  else {
    sVar6 = strlen(local_a8);
    RVar5 = 0x12e;
    if (sVar6 < 0x19) {
      local_70 = uVar11 & 0xffffffff;
      local_68 = local_70 << 4;
      lVar12 = 0;
      local_b8 = 0;
      RVar5 = 0x130;
      do {
        pAVar3 = local_98;
        pcVar14 = *(char **)((long)&local_98->attrName + lVar12);
        sVar6 = strlen(pcVar14);
        if (0x18 < sVar6) goto LAB_001086c4;
        uVar11 = *(ulong *)((long)&pAVar3->attrType + lVar12);
        iVar15 = (int)(uVar11 >> 0x20);
        if (((uVar11 != 0x400000003) && (1 < (uint)uVar11 || uVar11 >> 0x20 != 4)) &&
           (((uint)uVar11 != 2 || (0xfd < iVar15 - 1U)))) goto LAB_001086c4;
        std::__cxx11::string::string((string *)&local_90,pcVar14,&local_b1);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&local_90);
        if ((_Rb_tree_header *)iVar8._M_node != &local_60._M_impl.super__Rb_tree_header) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          goto LAB_001086a8;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_b8 = local_b8 + iVar15;
        lVar12 = lVar12 + 0x10;
      } while (local_68 != lVar12);
      RVar4 = RM_Manager::CreateFile(local_b0->rmm,local_a8,local_b8);
      RVar5 = 0x12e;
      if (RVar4 == 0) {
        RID::RID((RID *)&local_90);
        if (0 < (int)local_a0) {
          pAVar9 = &local_98->attrType;
          uVar11 = 0;
          iVar15 = 0;
          do {
            uVar2 = *(undefined8 *)pAVar9;
            attr.attrType = (int)uVar2;
            attr.attrLength = (int)((ulong)uVar2 >> 0x20);
            attr.attrName = ((AttrInfo *)(pAVar9 + -2))->attrName;
            RVar5 = InsertAttrCat(local_b0,local_a8,attr,iVar15,(int)uVar11);
            if (RVar5 != 0) goto LAB_0010888e;
            iVar15 = iVar15 + (int)((ulong)uVar2 >> 0x20);
            uVar11 = uVar11 + 1;
            pAVar9 = pAVar9 + 4;
          } while (local_70 != uVar11);
        }
        RVar5 = InsertRelCat(local_b0,local_a8,(int)local_a0,local_b8);
        if (RVar5 == 0) {
          RVar5 = RM_FileHandle::ForcePages(&local_b0->attrcatFH,-1);
          if (RVar5 == 0) {
            RVar5 = RM_FileHandle::ForcePages(&local_b0->relcatFH,-1);
          }
        }
LAB_0010888e:
        RID::~RID((RID *)&local_90);
      }
    }
  }
LAB_001086c4:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return RVar5;
}

Assistant:

RC SM_Manager::CreateTable(const char *relName,
                           int        attrCount,
                           AttrInfo   *attributes)
{
  cout << "CreateTable\n"
    << "   relName     =" << relName << "\n"
    << "   attrCount   =" << attrCount << "\n";
  for (int i = 0; i < attrCount; i++)
    cout << "   attributes[" << i << "].attrName=" << attributes[i].attrName
        << "   attrType="
        << (attributes[i].attrType == INT ? "INT" :
            attributes[i].attrType == MBR ? "MBR" :
            attributes[i].attrType == FLOAT ? "FLOAT" : "STRING")
        << "   attrLength=" << attributes[i].attrLength << "\n";

  RC rc = 0;
  set<string> relAttributes;

  // Check for appropraite # of attributes
  if(attrCount > MAXATTRS || attrCount < 1){
    printf("reaches here\n");
    return (SM_BADREL);
  }
  if(strlen(relName) > MAXNAME) // Check for valid relName size
    return (SM_BADRELNAME);

  // Check the attribute specifications
  int totalRecSize = 0;
  for(int i = 0; i < attrCount; i++){
    if(strlen(attributes[i].attrName) > MAXNAME) // check name size
      return (SM_BADATTR);
    if(! isValidAttrType(attributes[i])) // check type
      return (SM_BADATTR);
    totalRecSize += attributes[i].attrLength; 
    string attrString(attributes[i].attrName); // check attribute dups
    bool exists = (relAttributes.find(attrString) != relAttributes.end());
    if(exists)
      return (SM_BADREL);
    else
      relAttributes.insert(attrString);
  }

  // Passed error check. Now information in relcat and attrcat

  // Create a file for this relation. This will check for duplicate tables
  // of the same name.
  if((rc = rmm.CreateFile(relName, totalRecSize)))
    return (SM_BADRELNAME);

  // For each attribute, insert into attrcat:
  RID rid;
  int currOffset = 0;
  for(int i = 0; i < attrCount; i++){
    AttrInfo attr = attributes[i];
    if((rc = InsertAttrCat(relName, attr, currOffset, i)))
      return (rc);
    currOffset += attr.attrLength;
  }
    
  // Insert into RelCat
  if((rc = InsertRelCat(relName, attrCount, totalRecSize)))
    return (rc);

  // Make sure changes to attrcat and relcat are reflected
  if((rc = attrcatFH.ForcePages()) || (rc = relcatFH.ForcePages()))
    return (rc);

  return (0);
}